

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

ptr<Object> __thiscall Object::asObject(Object *this)

{
  element_type *this_00;
  Environment *this_01;
  element_type *object_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Object> pVar1;
  Object *this_local;
  ptr<Object> *object;
  
  make<Object,Environment&>((Environment *)this);
  this_00 = std::__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                      );
  this_01 = getEnvironment(this_00);
  object_00 = std::__shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2> *)this);
  Environment::setFunctionsOwner(this_01,object_00);
  pVar1.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<Object>)pVar1.super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Object> Object::asObject() {
    ptr<Object> object = make<Object>(members);
    object -> getEnvironment() -> setFunctionsOwner(object.get());
    return object;
}